

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

char * rsa2_invalid(ssh_key *key,uint flags)

{
  size_t sVar1;
  ssh_hashalg *psVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  
  sVar1 = mp_get_nbits((mp_int *)key[-7].vt);
  bVar5 = (flags & 4) == 0;
  pcVar3 = "rsa-sha2-512";
  if (bVar5) {
    pcVar3 = "ssh-rsa";
  }
  psVar2 = &ssh_sha512;
  if (bVar5) {
    psVar2 = &ssh_sha1;
  }
  if ((flags & 2) != 0) {
    pcVar3 = "rsa-sha2-256";
    psVar2 = &ssh_sha256;
  }
  if ((flags & 6) == 0) {
    lVar4 = 0x12;
  }
  else {
    lVar4 = 0x16;
    if (psVar2 != &ssh_sha512 && (char)((flags & 2) >> 1) == '\0') {
      __assert_fail("false && \"bad hash algorithm for RSA PKCS#1\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                    ,0x2ca,"ptrlen rsa_pkcs1_prefix_for_hash(const ssh_hashalg *)");
    }
  }
  if (sVar1 + 7 >> 3 < lVar4 + psVar2->hlen) {
    pcVar3 = dupprintf("%zu-bit RSA key is too short to generate %s signatures",sVar1,pcVar3);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

static char *rsa2_invalid(ssh_key *key, unsigned flags)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    size_t bits = mp_get_nbits(rsa->modulus), nbytes = (bits + 7) / 8;
    const char *sign_alg_name;
    const ssh_hashalg *halg = rsa2_hash_alg_for_flags(flags, &sign_alg_name);
    if (nbytes < rsa_pkcs1_length_of_fixed_parts(halg)) {
        return dupprintf(
            "%"SIZEu"-bit RSA key is too short to generate %s signatures",
            bits, sign_alg_name);
    }

    return NULL;
}